

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhash_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_799b06::LHashTest_Basic_Test::TestBody(LHashTest_Basic_Test *this)

{
  long lVar1;
  undefined1 auVar2 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  _Head_base<0UL,_char_*,_false> _Var6;
  _Head_base<0UL,_(anonymous_namespace)::lhash_st_char_*,_false> _Var7;
  int iVar8;
  uint32_t key_hash;
  _Rb_tree_node_base *p_Var9;
  ulong uVar10;
  mapped_type *pmVar11;
  uint uVar12;
  char *pcVar13;
  char *in_R9;
  pointer __p;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>_>
  pVar14;
  char *previous;
  AssertionResult gtest_ar_;
  ValueList actual;
  AssertionResult gtest_ar_1;
  unique_ptr<(anonymous_namespace)::lhash_st_char,_(anonymous_namespace)::FreeLHASH_OF_char> lh;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>_>
  dummy_lh;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_d0;
  undefined1 local_c8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined1 local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  AssertHelper local_88;
  _Head_base<0UL,_char_*,_false> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  _Head_base<0UL,_(anonymous_namespace)::lhash_st_char_*,_false> local_70;
  AssertHelper local_68;
  undefined1 local_60 [32];
  _Rb_tree_node_base *local_40;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_38;
  
  local_70._M_head_impl = (lhash_st_char *)OPENSSL_lh_new(OPENSSL_strhash,strcmp);
  local_c8[0] = (internal)((_LHASH *)local_70._M_head_impl != (_LHASH *)0x0);
  paStack_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
  if ((_LHASH *)local_70._M_head_impl == (_LHASH *)0x0) {
    testing::Message::Message((Message *)local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_60,(internal *)local_c8,(AssertionResult *)"lh","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/lhash/lhash_test.cc"
               ,0x42,(char *)local_60._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
      operator_delete((void *)local_60._0_8_,(ulong)(local_60._16_8_ + 1));
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
    if (paStack_c0 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&paStack_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paStack_c0);
    }
LAB_003224e1:
    std::unique_ptr<(anonymous_namespace)::lhash_st_char,_(anonymous_namespace)::FreeLHASH_OF_char>
    ::~unique_ptr((unique_ptr<(anonymous_namespace)::lhash_st_char,_(anonymous_namespace)::FreeLHASH_OF_char>
                   *)&local_70);
    return;
  }
  local_60._24_8_ = local_60 + 8;
  local_60._8_4_ = _S_red;
  local_60._16_8_ = (_Base_ptr)0x0;
  local_38._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  uVar12 = 0;
  local_40 = (_Rb_tree_node_base *)local_60._24_8_;
LAB_00321c2c:
  _Var7._M_head_impl = local_70._M_head_impl;
  local_a8._0_8_ = local_38._M_head_impl;
  local_80._M_head_impl = (char *)OPENSSL_lh_num_items((_LHASH *)local_70._M_head_impl);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_c8,"dummy_lh.size()","lh_char_num_items(lh.get())",
             (unsigned_long *)local_a8,(unsigned_long *)&local_80);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    pcVar13 = "";
    if (paStack_c0 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      pcVar13 = (char *)paStack_c0->_M_allocated_capacity;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/lhash/lhash_test.cc"
               ,0x4a,pcVar13);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  if (paStack_c0 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&paStack_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paStack_c0);
  }
  if ((uVar12 * 0x26e978d5 >> 3 | uVar12 * -0x60000000) < 0x418938) {
    local_c8 = (undefined1  [8])0x0;
    paStack_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
    local_b8._M_allocated_capacity = 0;
    local_98._M_allocated_capacity = 0;
    local_a8._0_8_ =
         (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )0x0;
    local_a8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    for (p_Var9 = (_Rb_tree_node_base *)local_60._24_8_; paVar3 = paStack_c0, auVar2 = local_c8,
        p_Var9 != (_Rb_tree_node_base *)(local_60 + 8);
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
      local_80._M_head_impl = *(char **)(p_Var9 + 2);
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)local_c8,(char **)&local_80);
    }
    if (local_c8 != (undefined1  [8])paStack_c0) {
      uVar10 = (long)paStack_c0 - (long)local_c8 >> 3;
      lVar1 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<char_const**,std::vector<char_const*,std::allocator<char_const*>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_c8,paStack_c0,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<char_const**,std::vector<char_const*,std::allocator<char_const*>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (auVar2,paVar3);
    }
    local_80._M_head_impl = (char *)TestBody::anon_class_1_0_00000001::__invoke;
    local_78 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8;
    OPENSSL_lh_doall_arg((_LHASH *)_Var7._M_head_impl,lh_char_call_doall_arg,(internal *)&local_80);
    uVar5 = local_a8._8_8_;
    uVar4 = local_a8._0_8_;
    if (local_a8._0_8_ != local_a8._8_8_) {
      uVar10 = (long)(local_a8._8_8_ - local_a8._0_8_) >> 3;
      lVar1 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<char_const**,std::vector<char_const*,std::allocator<char_const*>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_a8._0_8_,local_a8._8_8_,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<char_const**,std::vector<char_const*,std::allocator<char_const*>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (uVar4,uVar5);
    }
    testing::internal::
    CmpHelperEQ<std::vector<char_const*,std::allocator<char_const*>>,std::vector<char_const*,std::allocator<char_const*>>>
              ((internal *)&local_80,"expected","actual",
               (vector<const_char_*,_std::allocator<const_char_*>_> *)local_c8,
               (vector<const_char_*,_std::allocator<const_char_*>_> *)local_a8);
    if (local_80._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      pcVar13 = "";
      if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar13 = (local_78->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/lhash/lhash_test.cc"
                 ,0x61,pcVar13);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_head_impl !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_d0._M_head_impl + 8))();
      }
    }
    if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_78,local_78);
    }
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete((void *)local_a8._0_8_,local_98._M_allocated_capacity - local_a8._0_8_);
    }
    if (local_c8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_c8,local_b8._M_allocated_capacity - (long)local_c8);
    }
  }
  iVar8 = rand();
  iVar8 = iVar8 % 3;
  if (iVar8 == 2) {
    RandString();
    uVar4 = local_a8._0_8_;
    local_80._M_head_impl =
         (char *)OPENSSL_lh_delete((_LHASH *)local_70._M_head_impl,(void *)local_a8._0_8_,
                                   lh_char_call_hash_func,lh_char_call_cmp_func);
    local_d0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         Lookup((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>_>
                 *)local_60,(char *)uVar4);
    testing::internal::CmpHelperEQ<char_const*,char*>
              ((internal *)local_c8,"Lookup(&dummy_lh, key.get())","value",(char **)&local_d0,
               (char **)&local_80);
    if (local_c8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      pcVar13 = "";
      if (paStack_c0 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        pcVar13 = (char *)paStack_c0->_M_allocated_capacity;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/lhash/lhash_test.cc"
                 ,0x8a,pcVar13);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_head_impl !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_d0._M_head_impl + 8))();
      }
    }
    if (paStack_c0 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&paStack_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paStack_c0);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c8,(char *)uVar4,(allocator<char> *)&local_d0);
    pVar14 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>_>
             ::equal_range((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>_>
                            *)local_60,(key_type *)local_c8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>_>
    ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>_>
                    *)local_60,(_Base_ptr)pVar14.first._M_node,(_Base_ptr)pVar14.second._M_node);
    if (local_c8 != (undefined1  [8])&local_b8) {
      operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
    }
LAB_00322349:
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete__((void *)local_a8._0_8_);
    }
  }
  else if (iVar8 == 1) {
    RandString();
    _Var6._M_head_impl = local_80._M_head_impl;
    local_c8 = (undefined1  [8])0x0;
    iVar8 = OPENSSL_lh_insert((_LHASH *)local_70._M_head_impl,(void **)local_c8,
                              local_80._M_head_impl,lh_char_call_hash_func,lh_char_call_cmp_func);
    local_d0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8;
    local_a8[0] = iVar8 != 0;
    local_a8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar8 == 0) {
      testing::Message::Message((Message *)&local_88);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_c8,(internal *)local_a8,
                 (AssertionResult *)"lh_char_insert(lh.get(), &previous, key.get())","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/lhash/lhash_test.cc"
                 ,0x81,(char *)local_c8);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_88);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if (local_c8 != (undefined1  [8])&local_b8) {
        operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
      }
      if (local_88.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_88.data_ + 8))();
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_a8 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_a8._8_8_);
      }
      if ((code *)_Var6._M_head_impl != (code *)0x0) {
        operator_delete__(_Var6._M_head_impl);
      }
LAB_003224d7:
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>_>
                   *)local_60);
      goto LAB_003224e1;
    }
    local_a8._0_8_ =
         Lookup((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>_>
                 *)local_60,_Var6._M_head_impl);
    testing::internal::CmpHelperEQ<char_const*,char*>
              ((internal *)local_c8,"Lookup(&dummy_lh, key.get())","previous",(char **)local_a8,
               (char **)&local_d0);
    if (local_c8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_a8);
      pcVar13 = "";
      if (paStack_c0 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        pcVar13 = (char *)paStack_c0->_M_allocated_capacity;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/lhash/lhash_test.cc"
                 ,0x82,pcVar13);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_a8._0_8_ + 8))();
      }
    }
    if (paStack_c0 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&paStack_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paStack_c0);
    }
    _Var6._M_head_impl = local_80._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c8,local_80._M_head_impl,(allocator<char> *)local_a8);
    pmVar11 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>_>
                            *)local_60,(key_type *)local_c8);
    local_80._M_head_impl = (char *)0x0;
    pcVar13 = (pmVar11->_M_t).super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
              super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
              super__Head_base<0UL,_char_*,_false>._M_head_impl;
    (pmVar11->_M_t).super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl = _Var6._M_head_impl;
    if (pcVar13 != (char *)0x0) {
      operator_delete__(pcVar13);
    }
    if (local_c8 != (undefined1  [8])&local_b8) {
      operator_delete((void *)local_c8,local_b8._M_allocated_capacity + 1);
    }
    if (iVar8 == 0) goto LAB_003224d7;
  }
  else if (iVar8 == 0) {
    RandString();
    _Var7._M_head_impl = local_70._M_head_impl;
    local_80._M_head_impl =
         (char *)OPENSSL_lh_retrieve((_LHASH *)local_70._M_head_impl,(void *)local_a8._0_8_,
                                     lh_char_call_hash_func,lh_char_call_cmp_func);
    local_d0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         Lookup((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>_>
                 *)local_60,(char *)local_a8._0_8_);
    testing::internal::CmpHelperEQ<char_const*,char*>
              ((internal *)local_c8,"Lookup(&dummy_lh, key.get())","value",(char **)&local_d0,
               (char **)&local_80);
    if (local_c8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      pcVar13 = "";
      if (paStack_c0 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        pcVar13 = (char *)paStack_c0->_M_allocated_capacity;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/lhash/lhash_test.cc"
                 ,0x6f,pcVar13);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      if (local_d0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d0._M_head_impl + 8))();
      }
    }
    if (paStack_c0 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&paStack_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paStack_c0);
    }
    key_hash = OPENSSL_strhash((char *)local_a8._0_8_);
    local_c8 = (undefined1  [8])TestBody::anon_class_1_0_00000001::__invoke;
    paStack_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_a8;
    local_80._M_head_impl =
         (char *)OPENSSL_lh_retrieve_key
                           ((_LHASH *)_Var7._M_head_impl,(key_type *)local_c8,key_hash,
                            lh_char_call_cmp_key);
    local_d0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         Lookup((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>_>
                 *)local_60,(char *)local_a8._0_8_);
    testing::internal::CmpHelperEQ<char_const*,char*>
              ((internal *)local_c8,"Lookup(&dummy_lh, key.get())","value",(char **)&local_d0,
               (char **)&local_80);
    if (local_c8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_d0);
      pcVar13 = "";
      if (paStack_c0 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        pcVar13 = (char *)paStack_c0->_M_allocated_capacity;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/lhash/lhash_test.cc"
                 ,0x7a,pcVar13);
      testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_head_impl !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_d0._M_head_impl + 8))();
      }
    }
    if (paStack_c0 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&paStack_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)paStack_c0);
    }
    goto LAB_00322349;
  }
  if (0x1869e < uVar12) goto LAB_003224d7;
  uVar12 = uVar12 + 1;
  goto LAB_00321c2c;
}

Assistant:

static std::unique_ptr<char[]> RandString(void) {
  unsigned len = 1 + (rand() % 3);
  auto ret = std::make_unique<char[]>(len + 1);

  for (unsigned i = 0; i < len; i++) {
    ret[i] = '0' + (rand() & 7);
  }
  ret[len] = 0;

  return ret;
}